

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O0

char * read_string(scanner_t *s,va_list *ap,char *purpose,size_t *out_len,int *ours,int optional)

{
  uint uVar1;
  char *__s;
  int iVar2;
  size_t length_00;
  size_t local_d0;
  size_t *local_c8;
  int *local_b0;
  undefined8 *local_98;
  undefined8 *local_80;
  size_t local_68;
  size_t length;
  char *str;
  strbuffer_t strbuff;
  char t;
  int optional_local;
  int *ours_local;
  size_t *out_len_local;
  char *purpose_local;
  va_list *ap_local;
  scanner_t *s_local;
  
  strbuff.size._4_4_ = optional;
  next_token(s);
  strbuff.size._3_1_ = (s->token).token;
  prev_token(s);
  *ours = 0;
  if (((strbuff.size._3_1_ == '#') || (strbuff.size._3_1_ == '%')) || (strbuff.size._3_1_ == '+')) {
    if (strbuff.size._4_4_ == 0) {
      iVar2 = strbuffer_init((strbuffer_t *)&str);
      if (iVar2 != 0) {
        set_error(s,"<internal>",json_error_out_of_memory,"Out of memory");
        s->has_error = 1;
      }
      do {
        uVar1 = (*ap)[0].gp_offset;
        if (uVar1 < 0x29) {
          local_98 = (undefined8 *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
          (*ap)[0].gp_offset = uVar1 + 8;
        }
        else {
          local_98 = (undefined8 *)(*ap)[0].overflow_arg_area;
          (*ap)[0].overflow_arg_area = local_98 + 1;
        }
        __s = (char *)*local_98;
        if (__s == (char *)0x0) {
          set_error(s,"<args>",json_error_null_value,"NULL %s",purpose);
          s->has_error = 1;
        }
        next_token(s);
        if ((s->token).token == '#') {
          uVar1 = (*ap)[0].gp_offset;
          if (uVar1 < 0x29) {
            local_b0 = (int *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
            (*ap)[0].gp_offset = uVar1 + 8;
          }
          else {
            local_b0 = (int *)(*ap)[0].overflow_arg_area;
            (*ap)[0].overflow_arg_area = local_b0 + 2;
          }
          local_68 = (size_t)*local_b0;
        }
        else if ((s->token).token == '%') {
          uVar1 = (*ap)[0].gp_offset;
          if (uVar1 < 0x29) {
            local_c8 = (size_t *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
            (*ap)[0].gp_offset = uVar1 + 8;
          }
          else {
            local_c8 = (size_t *)(*ap)[0].overflow_arg_area;
            (*ap)[0].overflow_arg_area = local_c8 + 1;
          }
          local_68 = *local_c8;
        }
        else {
          prev_token(s);
          if (s->has_error == 0) {
            local_d0 = strlen(__s);
          }
          else {
            local_d0 = 0;
          }
          local_68 = local_d0;
        }
        if ((s->has_error == 0) &&
           (iVar2 = strbuffer_append_bytes((strbuffer_t *)&str,__s,local_68), iVar2 == -1)) {
          set_error(s,"<internal>",json_error_out_of_memory,"Out of memory");
          s->has_error = 1;
        }
        next_token(s);
      } while ((s->token).token == '+');
      prev_token(s);
      if (s->has_error == 0) {
        iVar2 = utf8_check_string(str,(size_t)strbuff.value);
        if (iVar2 == 0) {
          set_error(s,"<args>",json_error_invalid_utf8,"Invalid UTF-8 %s",purpose);
          strbuffer_close((strbuffer_t *)&str);
          s->has_error = 1;
          s_local = (scanner_t *)0x0;
        }
        else {
          *out_len = (size_t)strbuff.value;
          *ours = 1;
          s_local = (scanner_t *)strbuffer_steal_value((strbuffer_t *)&str);
        }
      }
      else {
        strbuffer_close((strbuffer_t *)&str);
        s_local = (scanner_t *)0x0;
      }
    }
    else {
      set_error(s,"<format>",json_error_invalid_format,"Cannot use \'%c\' on optional strings",
                (ulong)(uint)(int)strbuff.size._3_1_);
      s->has_error = 1;
      s_local = (scanner_t *)0x0;
    }
  }
  else {
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      local_80 = (undefined8 *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      local_80 = (undefined8 *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = local_80 + 1;
    }
    s_local = (scanner_t *)*local_80;
    if (s_local == (scanner_t *)0x0) {
      if (strbuff.size._4_4_ == 0) {
        set_error(s,"<args>",json_error_null_value,"NULL %s",purpose);
        s->has_error = 1;
      }
      s_local = (scanner_t *)0x0;
    }
    else {
      length_00 = strlen((char *)s_local);
      iVar2 = utf8_check_string((char *)s_local,length_00);
      if (iVar2 == 0) {
        set_error(s,"<args>",json_error_invalid_utf8,"Invalid UTF-8 %s",purpose);
        s->has_error = 1;
        s_local = (scanner_t *)0x0;
      }
      else {
        *out_len = length_00;
      }
    }
  }
  return (char *)s_local;
}

Assistant:

static char *read_string(scanner_t *s, va_list *ap, const char *purpose, size_t *out_len,
                         int *ours, int optional) {
    char t;
    strbuffer_t strbuff;
    const char *str;
    size_t length;

    next_token(s);
    t = token(s);
    prev_token(s);

    *ours = 0;
    if (t != '#' && t != '%' && t != '+') {
        /* Optimize the simple case */
        str = va_arg(*ap, const char *);

        if (!str) {
            if (!optional) {
                set_error(s, "<args>", json_error_null_value, "NULL %s", purpose);
                s->has_error = 1;
            }
            return NULL;
        }

        length = strlen(str);

        if (!utf8_check_string(str, length)) {
            set_error(s, "<args>", json_error_invalid_utf8, "Invalid UTF-8 %s", purpose);
            s->has_error = 1;
            return NULL;
        }

        *out_len = length;
        return (char *) str;
    } else if (optional) {
        set_error(s, "<format>", json_error_invalid_format,
                  "Cannot use '%c' on optional strings", t);
        s->has_error = 1;

        return NULL;
    }

    if (strbuffer_init(&strbuff)) {
        set_error(s, "<internal>", json_error_out_of_memory, "Out of memory");
        s->has_error = 1;
    }

    while (1) {
        str = va_arg(*ap, const char *);
        if (!str) {
            set_error(s, "<args>", json_error_null_value, "NULL %s", purpose);
            s->has_error = 1;
        }

        next_token(s);

        if (token(s) == '#') {
            length = va_arg(*ap, int);
        } else if (token(s) == '%') {
            length = va_arg(*ap, size_t);
        } else {
            prev_token(s);
            length = s->has_error ? 0 : strlen(str);
        }

        if (!s->has_error && strbuffer_append_bytes(&strbuff, str, length) == -1) {
            set_error(s, "<internal>", json_error_out_of_memory, "Out of memory");
            s->has_error = 1;
        }

        next_token(s);
        if (token(s) != '+') {
            prev_token(s);
            break;
        }
    }

    if (s->has_error) {
        strbuffer_close(&strbuff);
        return NULL;
    }

    if (!utf8_check_string(strbuff.value, strbuff.length)) {
        set_error(s, "<args>", json_error_invalid_utf8, "Invalid UTF-8 %s", purpose);
        strbuffer_close(&strbuff);
        s->has_error = 1;
        return NULL;
    }

    *out_len = strbuff.length;
    *ours = 1;
    return strbuffer_steal_value(&strbuff);
}